

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat)

{
  int iVar1;
  pointer pMVar2;
  Mat bottom_blob_unpacked;
  
  iVar1 = -1;
  if (-1 < blob_index) {
    pMVar2 = (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (blob_index <
        (int)((ulong)((long)(this->blob_mats).
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pMVar2) >> 6)) {
      iVar1 = 0;
      if (pMVar2[(uint)blob_index].dims == 0) {
        iVar1 = Net::forward_layer(this->net,
                                   (this->net->blobs).
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                   _M_impl.super__Vector_impl_data._M_start[(uint)blob_index].
                                   producer,&this->blob_mats,&this->opt);
        pMVar2 = (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      Mat::operator=(feat,pMVar2 + (uint)blob_index);
      if ((this->opt).use_packing_layout == true) {
        bottom_blob_unpacked.elemsize._0_4_ = 0;
        bottom_blob_unpacked._20_8_ = 0;
        bottom_blob_unpacked.data = (void *)0x0;
        bottom_blob_unpacked.refcount._0_4_ = 0;
        bottom_blob_unpacked.refcount._4_4_ = 0;
        bottom_blob_unpacked.allocator = (Allocator *)0x0;
        bottom_blob_unpacked.dims = 0;
        bottom_blob_unpacked.w = 0;
        bottom_blob_unpacked.h = 0;
        bottom_blob_unpacked.c = 0;
        bottom_blob_unpacked.cstep = 0;
        convert_packing(feat,&bottom_blob_unpacked,1,&this->opt);
        Mat::operator=(feat,&bottom_blob_unpacked);
        Mat::~Mat(&bottom_blob_unpacked);
      }
    }
  }
  return iVar1;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat)
{
    if (blob_index < 0 || blob_index >= (int)blob_mats.size())
        return -1;

    int ret = 0;

    if (blob_mats[blob_index].dims == 0)
    {
        int layer_index = net->blobs[blob_index].producer;

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            // use local allocator
            if (!opt.blob_vkallocator)
            {
                local_blob_vkallocator = net->vkdev->acquire_blob_allocator();
                opt.blob_vkallocator = local_blob_vkallocator;
            }
            if (!opt.workspace_vkallocator)
            {
                opt.workspace_vkallocator = opt.blob_vkallocator;
            }
            if (!opt.staging_vkallocator)
            {
                local_staging_vkallocator = net->vkdev->acquire_staging_allocator();
                opt.staging_vkallocator = local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(net->vkdev);
#if NCNN_BENCHMARK
            cmd.create_query_pool(net->layers.size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, blob_mats[blob_index], opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(net->layers.size() * 2);
                    cmd.get_query_pool_results(0, net->layers.size() * 2, results);
                    for (size_t i=0; i<net->layers.size(); i++)
                    {
                        uint64_t start = results[i*2];
                        uint64_t end = results[i*2+1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * net->vkdev->info.timestamp_period / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", net->layers[i]->type.c_str(), net->layers[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, blob_mats[blob_index], opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(net->layers.size() * 2);
                    cmd.get_query_pool_results(0, net->layers.size() * 2, results);
                    for (size_t i=0; i<net->layers.size(); i++)
                    {
                        uint64_t start = results[i*2];
                        uint64_t end = results[i*2+1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * net->vkdev->info.timestamp_period / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", net->layers[i]->type.c_str(), net->layers[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = net->forward_layer(layer_index, blob_mats, opt);
        }
#else
        ret = net->forward_layer(layer_index, blob_mats, opt);
#endif // NCNN_VULKAN

    }

    feat = blob_mats[blob_index];

    if (opt.use_packing_layout)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, opt);
        feat = bottom_blob_unpacked;
    }

    return ret;
}